

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O0

FILE * usrc_createWithHeader(char *path,char *filename,char *header,char *generator)

{
  size_t sVar1;
  FILE *pFVar2;
  char *local_470;
  time_t local_458;
  time_t t;
  tm *lt;
  FILE *pFStack_440;
  char c;
  FILE *f;
  char *q;
  char *p;
  char buffer [1024];
  char *generator_local;
  char *header_local;
  char *filename_local;
  char *path_local;
  
  q = filename;
  buffer._1016_8_ = generator;
  if (path != (char *)0x0) {
    strcpy((char *)&p,path);
    sVar1 = strlen((char *)&p);
    pFVar2 = (FILE *)(buffer + (sVar1 - 8));
    f = pFVar2;
    if ((((FILE *)&p < pFVar2) && (lt._7_1_ = *(char *)((long)&q + sVar1 + 7), lt._7_1_ != '/')) &&
       (lt._7_1_ != '/')) {
      f = (FILE *)(buffer + (sVar1 - 7));
      *pFVar2 = (FILE)0x2f;
    }
    strcpy((char *)f,filename);
    q = (char *)&p;
  }
  pFStack_440 = fopen(q,"w");
  if (pFStack_440 == (FILE *)0x0) {
    local_470 = path;
    if (path == (char *)0x0) {
      local_470 = "";
    }
    fprintf(_stderr,"usrc_create(%s, %s): unable to create file\n",local_470,filename);
  }
  else {
    time(&local_458);
    t = (time_t)localtime(&local_458);
    if (buffer._1016_8_ == 0) {
      strftime((char *)&p,0x400,"%Y-%m-%d",(tm *)t);
      fprintf(pFStack_440,header,filename,&p);
    }
    else {
      fprintf(pFStack_440,header,filename,buffer._1016_8_);
    }
  }
  return (FILE *)pFStack_440;
}

Assistant:

static FILE *
usrc_createWithHeader(const char *path, const char *filename,
                      const char *header, const char *generator) {
    char buffer[1024];
    const char *p;
    char *q;
    FILE *f;
    char c;

    if(path==NULL) {
        p=filename;
    } else {
        /* concatenate path and filename, with U_FILE_SEP_CHAR in between if necessary */
        uprv_strcpy(buffer, path);
        q=buffer+uprv_strlen(buffer);
        if(q>buffer && (c=*(q-1))!=U_FILE_SEP_CHAR && c!=U_FILE_ALT_SEP_CHAR) {
            *q++=U_FILE_SEP_CHAR;
        }
        uprv_strcpy(q, filename);
        p=buffer;
    }

    f=fopen(p, "w");
    if(f!=NULL) {
        const struct tm *lt;
        time_t t;

        time(&t);
        lt=localtime(&t);
        if(generator==NULL) {
            strftime(buffer, sizeof(buffer), "%Y-%m-%d", lt);
            fprintf(f, header, filename, buffer);
        } else {
            fprintf(f, header, filename, generator);
        }
    } else {
        fprintf(
            stderr,
            "usrc_create(%s, %s): unable to create file\n",
            path!=NULL ? path : "", filename);
    }
    return f;
}